

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

void reportOption(FILE *file,HighsLogOptions *log_options,OptionRecordInt *option,
                 bool report_only_deviations,HighsFileType file_type)

{
  undefined7 in_register_00000009;
  string *this;
  string line;
  string local_80;
  string local_60;
  string local_40;
  
  if (((int)CONCAT71(in_register_00000009,report_only_deviations) == 0) ||
     (option->default_value != *option->value)) {
    if (file_type == kFull) {
      fprintf((FILE *)file,"\n# %s\n",(option->super_OptionRecord).description._M_dataplus._M_p);
      highsBoolToString_abi_cxx11_(&line,(option->super_OptionRecord).advanced,2);
      fprintf((FILE *)file,"# [type: integer, advanced: %s, range: {%d, %d}, default: %d]\n",
              line._M_dataplus._M_p,(ulong)(uint)option->lower_bound,
              (ulong)(uint)option->upper_bound,(ulong)(uint)option->default_value);
      std::__cxx11::string::~string((string *)&line);
      fprintf((FILE *)file,"%s = %d\n",(option->super_OptionRecord).name._M_dataplus._M_p,
              (ulong)(uint)*option->value);
    }
    else {
      if (file_type == kMd) {
        std::__cxx11::string::string
                  ((string *)&local_60,(string *)&(option->super_OptionRecord).name);
        highsInsertMdEscapes(&line,&local_60);
        std::__cxx11::string::string
                  ((string *)&local_80,(string *)&(option->super_OptionRecord).description);
        highsInsertMdEscapes(&local_40,&local_80);
        fprintf((FILE *)file,"## %s\n- %s\n- Type: integer\n- Range: {%d, %d}\n- Default: %d\n\n",
                line._M_dataplus._M_p,local_40._M_dataplus._M_p,(ulong)(uint)option->lower_bound,
                (ulong)(uint)option->upper_bound,option->default_value);
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&line);
        this = &local_60;
      }
      else {
        highsFormatToString_abi_cxx11_
                  (&line,"Set option %s to %d\n",(option->super_OptionRecord).name._M_dataplus._M_p,
                   (ulong)(uint)*option->value);
        if (_stdout == file) {
          highsLogUser(log_options,kInfo,"%s");
        }
        else {
          fputs(line._M_dataplus._M_p,(FILE *)file);
        }
        this = &line;
      }
      std::__cxx11::string::~string((string *)this);
    }
  }
  return;
}

Assistant:

void reportOption(FILE* file, const HighsLogOptions& log_options,
                  const OptionRecordInt& option,
                  const bool report_only_deviations,
                  const HighsFileType file_type) {
  if (!report_only_deviations || option.default_value != *option.value) {
    if (file_type == HighsFileType::kMd) {
      fprintf(
          file,
          "## %s\n- %s\n- Type: integer\n- Range: {%d, %d}\n- Default: %d\n\n",
          highsInsertMdEscapes(option.name).c_str(),
          highsInsertMdEscapes(option.description).c_str(),
          int(option.lower_bound), int(option.upper_bound),
          int(option.default_value));
    } else if (file_type == HighsFileType::kFull) {
      fprintf(file, "\n# %s\n", option.description.c_str());
      fprintf(file,
              "# [type: integer, advanced: %s, range: {%" HIGHSINT_FORMAT
              ", %d}, default: %d]\n",
              highsBoolToString(option.advanced).c_str(), option.lower_bound,
              int(option.upper_bound), int(option.default_value));
      fprintf(file, "%s = %d\n", option.name.c_str(), int(*option.value));
    } else {
      std::string line = highsFormatToString(
          "Set option %s to %d\n", option.name.c_str(), int(*option.value));
      if (file == stdout) {
        highsLogUser(log_options, HighsLogType::kInfo, "%s", line.c_str());
      } else {
        fprintf(file, "%s", line.c_str());
      }
    }
  }
}